

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerResults.cpp
# Opt level: O0

void __thiscall
MidiAnalyzerResults::GenerateBubbleText
          (MidiAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  stash stash1;
  undefined8 uStack_50;
  MidiFrameType FrameType;
  Frame frame;
  undefined8 local_40;
  stash sStack_38;
  undefined2 local_30;
  DisplayBase display_base_local;
  Channel *channel_local;
  U64 frame_index_local;
  MidiAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)&stack0xffffffffffffffb0);
  this->localDisplay_base = display_base;
  *(undefined2 *)&this->field_0x40 = local_30;
  *(undefined8 *)&this->field_0x30 = local_40;
  *(stash *)&this->field_0x38 = sStack_38;
  *(undefined8 *)&this->localFrame = uStack_50;
  *(undefined8 *)&this->field_0x28 = _frame;
  this->localFrame_index = frame_index;
  results(this,(uint)(byte)local_30,sStack_38);
  Frame::~Frame((Frame *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void MidiAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    enum MidiFrameType FrameType;
    union stash stash1;
    FrameType = ( enum MidiFrameType )frame.mType;
    stash1.mData2 = frame.mData2;

    localDisplay_base = display_base;
    localFrame = frame;
    localFrame_index = frame_index;


    results( FrameType, stash1 );
}